

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

int mp_compare_uint(char *data_a,char *data_b)

{
  uint8_t type;
  uint8_t type_00;
  byte bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint local_4c;
  uint local_3c;
  ulong local_38;
  uint64_t b;
  uint64_t a;
  uint8_t cb;
  char *pcStack_20;
  uint8_t ca;
  char *data_b_local;
  char *data_a_local;
  
  pcStack_20 = data_b;
  data_b_local = data_a;
  type = mp_load_u8(&data_b_local);
  type_00 = mp_load_u8(&stack0xffffffffffffffe0);
  if (type == type_00) {
    switch(type) {
    case 0xcc:
      bVar1 = mp_load_u8(&data_b_local);
      b = (uint64_t)bVar1;
      bVar1 = mp_load_u8(&stack0xffffffffffffffe0);
      local_38 = (ulong)bVar1;
      break;
    case 0xcd:
      uVar2 = mp_load_u16(&data_b_local);
      b = (uint64_t)uVar2;
      uVar2 = mp_load_u16(&stack0xffffffffffffffe0);
      local_38 = (ulong)uVar2;
      break;
    case 0xce:
      uVar3 = mp_load_u32(&data_b_local);
      b = (uint64_t)uVar3;
      uVar3 = mp_load_u32(&stack0xffffffffffffffe0);
      local_38 = (ulong)uVar3;
      break;
    case 0xcf:
      b = mp_load_u64(&data_b_local);
      local_38 = mp_load_u64(&stack0xffffffffffffffe0);
      break;
    default:
      return 0;
    }
    if (b < local_38) {
      local_4c = 0xffffffff;
    }
    else {
      local_4c = (uint)(local_38 < b);
    }
    data_a_local._4_4_ = local_4c;
  }
  else {
    uVar4 = mp_decode_uint_data(type,&data_b_local);
    uVar5 = mp_decode_uint_data(type_00,&stack0xffffffffffffffe0);
    if (uVar4 < uVar5) {
      local_3c = 0xffffffff;
    }
    else {
      local_3c = (uint)(uVar5 < uVar4);
    }
    data_a_local._4_4_ = local_3c;
  }
  return data_a_local._4_4_;
}

Assistant:

MP_IMPL int
mp_compare_uint(const char *data_a, const char *data_b)
{
	uint8_t ca = mp_load_u8(&data_a);
	uint8_t cb = mp_load_u8(&data_b);
	uint64_t a, b;
	if (ca != cb) {
		a = mp_decode_uint_data(ca, &data_a);
		b = mp_decode_uint_data(cb, &data_b);
		return a < b ? -1 : a > b;
	}
	switch (ca) {
	case 0xcc:
		a = mp_load_u8(&data_a);
		b = mp_load_u8(&data_b);
		break;
	case 0xcd:
		a = mp_load_u16(&data_a);
		b = mp_load_u16(&data_b);
		break;
	case 0xce:
		a = mp_load_u32(&data_a);
		b = mp_load_u32(&data_b);
		break;
	case 0xcf:
		a = mp_load_u64(&data_a);
		b = mp_load_u64(&data_b);
		break;
	default:
		return 0;
	}
	return a < b ? -1 : a > b;
}